

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormatString.hpp
# Opt level: O0

void Diligent::
     FormatStrSS<std::__cxx11::stringstream,char[43],unsigned_int,char[45],unsigned_int,char[30]>
               (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *ss,
               char (*FirstArg) [43],uint *RestArgs,char (*RestArgs_1) [45],uint *RestArgs_2,
               char (*RestArgs_3) [30])

{
  char (*RestArgs_local_3) [30];
  uint *RestArgs_local_2;
  char (*RestArgs_local_1) [45];
  uint *RestArgs_local;
  char (*FirstArg_local) [43];
  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *ss_local;
  
  FormatStrSS<std::__cxx11::stringstream,char[43]>(ss,FirstArg);
  FormatStrSS<std::__cxx11::stringstream,unsigned_int,char[45],unsigned_int,char[30]>
            (ss,RestArgs,RestArgs_1,RestArgs_2,RestArgs_3);
  return;
}

Assistant:

void FormatStrSS(SSType& ss, const FirstArgType& FirstArg, const RestArgsType&... RestArgs)
{
    FormatStrSS(ss, FirstArg);
    FormatStrSS(ss, RestArgs...); // recursive call using pack expansion syntax
}